

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StringNew * __thiscall
wasm::Builder::makeStringNew
          (Builder *this,StringNewOp op,Expression *ref,Expression *start,Expression *end)

{
  StringNew *pSVar1;
  bool local_39;
  StringNew *ret;
  Expression *end_local;
  Expression *start_local;
  Expression *ref_local;
  StringNewOp op_local;
  Builder *this_local;
  
  local_39 = start != (Expression *)0x0 && end != (Expression *)0x0;
  if (local_39 != (op == StringNewFromCodePoint)) {
    pSVar1 = MixedArena::alloc<wasm::StringNew>(&this->wasm->allocator);
    pSVar1->op = op;
    pSVar1->ref = ref;
    pSVar1->start = start;
    pSVar1->end = end;
    wasm::StringNew::finalize();
    return pSVar1;
  }
  __assert_fail("(start && end) != (op == StringNewFromCodePoint)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x461,
                "StringNew *wasm::Builder::makeStringNew(StringNewOp, Expression *, Expression *, Expression *)"
               );
}

Assistant:

StringNew* makeStringNew(StringNewOp op,
                           Expression* ref,
                           Expression* start = nullptr,
                           Expression* end = nullptr) {
    assert((start && end) != (op == StringNewFromCodePoint));
    auto* ret = wasm.allocator.alloc<StringNew>();
    ret->op = op;
    ret->ref = ref;
    ret->start = start;
    ret->end = end;
    ret->finalize();
    return ret;
  }